

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.h
# Opt level: O0

void __thiscall
TypedImageChannel<Imath_3_2::half>::TypedImageChannel
          (TypedImageChannel<Imath_3_2::half> *this,Image *image,int xSampling,int ySampling)

{
  ArgExc *this_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  Image *in_RSI;
  ImageChannel *in_RDI;
  long in_stack_ffffffffffffffc0;
  
  ImageChannel::ImageChannel(in_RDI,in_RSI);
  in_RDI->_vptr_ImageChannel = (_func_int **)&PTR__TypedImageChannel_00110c30;
  *(undefined4 *)&in_RDI[1]._vptr_ImageChannel = in_EDX;
  *(undefined4 *)((long)&in_RDI[1]._vptr_ImageChannel + 4) = in_ECX;
  Imf_3_4::Array2D<Imath_3_2::half>::Array2D
            ((Array2D<Imath_3_2::half> *)&in_RDI[1]._image,(long)in_RDI,in_stack_ffffffffffffffc0);
  if ((0 < *(int *)&in_RDI[1]._vptr_ImageChannel) &&
     (0 < *(int *)((long)&in_RDI[1]._vptr_ImageChannel + 4))) {
    (*in_RDI->_vptr_ImageChannel[4])();
    return;
  }
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,"Invalid x/y sampling values");
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

TypedImageChannel<T>::TypedImageChannel (
    Image& image, int xSampling, int ySampling)
    : ImageChannel (image)
    , _xSampling (xSampling)
    , _ySampling (ySampling)
    , _pixels (0, 0)
{
    if (_xSampling < 1 || _ySampling < 1)
        throw IEX_NAMESPACE::ArgExc ("Invalid x/y sampling values");
    resize ();
}